

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv__udp_maybe_deferred_bind(uv_udp_t *handle,int domain,uint flags)

{
  int iVar1;
  uint addrlen;
  sockaddr_in *addr;
  anon_union_28_3_c0956edd taddr;
  sockaddr_in local_28;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  
  addr = &local_28;
  iVar1 = 0;
  if ((handle->io_watcher).fd == -1) {
    if (domain == 10) {
      uStack_10 = 0;
      local_28.sin_family = 10;
      local_28.sin_port = 0;
      local_28.sin_addr.s_addr = 0;
      local_28.sin_zero._0_4_ = SUB84(_in6addr_any,0);
      local_28.sin_zero._4_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_18 = (undefined4)___dynamic_cast;
      uStack_14 = (undefined4)((ulong)___dynamic_cast >> 0x20);
      addrlen = 0x1c;
    }
    else {
      if (domain != 2) {
        __assert_fail("0 && \"unsupported address family\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x178,"int uv__udp_maybe_deferred_bind(uv_udp_t *, int, unsigned int)");
      }
      local_28.sin_zero[0] = '\0';
      local_28.sin_zero[1] = '\0';
      local_28.sin_zero[2] = '\0';
      local_28.sin_zero[3] = '\0';
      local_28.sin_zero[4] = '\0';
      local_28.sin_zero[5] = '\0';
      local_28.sin_zero[6] = '\0';
      local_28.sin_zero[7] = '\0';
      local_28.sin_family = 2;
      local_28.sin_port = 0;
      local_28.sin_addr.s_addr = 0;
      addrlen = 0x10;
    }
    iVar1 = uv__udp_bind(handle,(sockaddr *)addr,addrlen,flags);
  }
  return iVar1;
}

Assistant:

static int uv__udp_maybe_deferred_bind(uv_udp_t* handle,
                                       int domain,
                                       unsigned int flags) {
  union {
    struct sockaddr_in6 in6;
    struct sockaddr_in in;
    struct sockaddr addr;
  } taddr;
  socklen_t addrlen;

  if (handle->io_watcher.fd != -1)
    return 0;

  switch (domain) {
  case AF_INET:
  {
    struct sockaddr_in* addr = &taddr.in;
    memset(addr, 0, sizeof *addr);
    addr->sin_family = AF_INET;
    addr->sin_addr.s_addr = INADDR_ANY;
    addrlen = sizeof *addr;
    break;
  }
  case AF_INET6:
  {
    struct sockaddr_in6* addr = &taddr.in6;
    memset(addr, 0, sizeof *addr);
    addr->sin6_family = AF_INET6;
    addr->sin6_addr = in6addr_any;
    addrlen = sizeof *addr;
    break;
  }
  default:
    assert(0 && "unsupported address family");
    abort();
  }

  return uv__udp_bind(handle, &taddr.addr, addrlen, flags);
}